

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::GetTics(AActor *this,FState *newstate)

{
  bool bVar1;
  int tics;
  FState *newstate_local;
  AActor *this_local;
  
  this_local._4_4_ = FState::GetTics(newstate);
  bVar1 = isFast(this);
  if ((bVar1) && (bVar1 = FState::GetFast(newstate), bVar1)) {
    this_local._4_4_ = this_local._4_4_ - (this_local._4_4_ >> 1);
  }
  else {
    bVar1 = isSlow(this);
    if ((bVar1) && (bVar1 = FState::GetSlow(newstate), bVar1)) {
      this_local._4_4_ = this_local._4_4_ << 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int AActor::GetTics(FState * newstate)
{
	int tics = newstate->GetTics();
	if (isFast() && newstate->GetFast())
	{
		return tics - (tics>>1);
	}
	else if (isSlow() && newstate->GetSlow())
	{
		return tics<<1;
	}
	return tics;
}